

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int do_decrypt_packet(ptls_cipher_context_t *header_protection,
                     _func_int_void_ptr_uint64_t_quicly_decoded_packet_t_ptr_size_t_size_t_ptr
                     *aead_cb,void *aead_ctx,uint64_t *next_expected_pn,
                     quicly_decoded_packet_t *packet,uint64_t *pn,ptls_iovec_t *payload)

{
  byte bVar1;
  long lVar2;
  uint64_t uVar3;
  uint64_t *in_RCX;
  undefined8 in_RDX;
  code *in_RSI;
  long *in_RDI;
  long *in_R8;
  ulong *in_R9;
  ptls_iovec_t pVar4;
  undefined8 *in_stack_00000008;
  size_t aead_off;
  int ret;
  size_t i;
  size_t ptlen;
  size_t pnlen;
  uint32_t pnbits;
  uint8_t hpmask [5];
  size_t encrypted_len;
  void *in_stack_ffffffffffffff68;
  ptls_cipher_context_t *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff78 [16];
  long local_68;
  size_t local_60;
  long local_58;
  uint32_t local_4c;
  byte local_45;
  byte abStack_44 [4];
  ulong local_40;
  ulong *local_38;
  long *local_30;
  uint64_t *local_28;
  undefined8 local_20;
  code *local_18;
  long *local_10;
  int local_4;
  
  local_40 = in_R8[1] - in_R8[0xc];
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_45,0,5);
  local_4c = 0;
  if (local_40 < *(long *)(*local_10 + 0x18) + 4U) {
    *local_38 = 0xffffffffffffffff;
    local_4 = 0xff01;
  }
  else {
    ptls_cipher_init(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    ptls_cipher_encrypt(in_stack_ffffffffffffff78._8_8_,in_stack_ffffffffffffff78._0_8_,
                        in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    bVar1 = 0x1f;
    if ((*(byte *)*local_30 & 0x80) != 0) {
      bVar1 = 0xf;
    }
    *(byte *)*local_30 = *(byte *)*local_30 ^ local_45 & bVar1;
    local_58 = (long)(int)((*(byte *)*local_30 & 3) + 1);
    for (local_68 = 0; local_68 != local_58; local_68 = local_68 + 1) {
      *(byte *)(*local_30 + local_30[0xc] + local_68) =
           *(byte *)(*local_30 + local_30[0xc] + local_68) ^ abStack_44[local_68];
      local_4c = local_4c << 8 | (uint)*(byte *)(*local_30 + local_30[0xc] + local_68);
    }
    lVar2 = local_30[0xc] + local_58;
    uVar3 = quicly_determine_packet_number(local_4c,local_58 << 3,*local_28);
    *local_38 = uVar3;
    local_4 = (*local_18)(local_20,*local_38,local_30,lVar2,&local_60);
    if (local_4 == 0) {
      if (*local_28 <= *local_38) {
        *local_28 = *local_38 + 1;
      }
      pVar4 = ptls_iovec_init((void *)(*local_30 + lVar2),local_60);
      *in_stack_00000008 = pVar4.base;
      in_stack_00000008[1] = pVar4.len;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int do_decrypt_packet(ptls_cipher_context_t *header_protection,
                             int (*aead_cb)(void *, uint64_t, quicly_decoded_packet_t *, size_t, size_t *), void *aead_ctx,
                             uint64_t *next_expected_pn, quicly_decoded_packet_t *packet, uint64_t *pn, ptls_iovec_t *payload)
{
    size_t encrypted_len = packet->octets.len - packet->encrypted_off;
    uint8_t hpmask[5] = {0};
    uint32_t pnbits = 0;
    size_t pnlen, ptlen, i;
    int ret;

    /* decipher the header protection, as well as obtaining pnbits, pnlen */
    if (encrypted_len < header_protection->algo->iv_size + QUICLY_MAX_PN_SIZE) {
        *pn = UINT64_MAX;
        return QUICLY_ERROR_PACKET_IGNORED;
    }
    ptls_cipher_init(header_protection, packet->octets.base + packet->encrypted_off + QUICLY_MAX_PN_SIZE);
    ptls_cipher_encrypt(header_protection, hpmask, hpmask, sizeof(hpmask));
    packet->octets.base[0] ^= hpmask[0] & (QUICLY_PACKET_IS_LONG_HEADER(packet->octets.base[0]) ? 0xf : 0x1f);
    pnlen = (packet->octets.base[0] & 0x3) + 1;
    for (i = 0; i != pnlen; ++i) {
        packet->octets.base[packet->encrypted_off + i] ^= hpmask[i + 1];
        pnbits = (pnbits << 8) | packet->octets.base[packet->encrypted_off + i];
    }

    size_t aead_off = packet->encrypted_off + pnlen;
    *pn = quicly_determine_packet_number(pnbits, pnlen * 8, *next_expected_pn);

    /* AEAD decryption */
    if ((ret = (*aead_cb)(aead_ctx, *pn, packet, aead_off, &ptlen)) != 0) {
        if (QUICLY_DEBUG)
            fprintf(stderr, "%s: aead decryption failure (pn: %" PRIu64 ",code:%d)\n", __FUNCTION__, *pn, ret);
        return ret;
    }
    if (*next_expected_pn <= *pn)
        *next_expected_pn = *pn + 1;

    *payload = ptls_iovec_init(packet->octets.base + aead_off, ptlen);
    return 0;
}